

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.hpp
# Opt level: O3

ssize_t __thiscall
boost::deflate::detail::window::write(window *this,int __fd,void *__buf,size_t __n)

{
  _Head_base<0UL,_unsigned_char_*,_false> __s;
  ulong uVar1;
  ulong uVar2;
  void *pvVar3;
  ushort uVar4;
  undefined4 in_register_00000034;
  void *__n_00;
  size_t __n_01;
  pointer __old_p;
  ushort uVar5;
  
  pvVar3 = (void *)CONCAT44(in_register_00000034,__fd);
  __s._M_head_impl =
       (this->p_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
       _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  uVar5 = this->capacity_;
  __n_00 = (void *)(ulong)uVar5;
  if (__s._M_head_impl == (uchar *)0x0) {
    __s._M_head_impl = (uchar *)operator_new__((ulong)__n_00);
    memset(__s._M_head_impl,0,(size_t)__n_00);
    (this->p_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
    .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __s._M_head_impl;
  }
  if (__buf < __n_00) {
    uVar1 = (ulong)this->i_;
    if (__n_00 < (void *)(uVar1 + (long)__buf)) {
      __n_01 = (long)__n_00 - uVar1;
      memcpy(__s._M_head_impl + uVar1,pvVar3,__n_01);
      uVar5 = (short)__buf - (short)__n_01;
      this->i_ = uVar5;
      memcpy((this->p_)._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
             (void *)((long)pvVar3 + __n_01),(ulong)uVar5);
      uVar2 = (ulong)this->capacity_;
      this->size_ = this->capacity_;
    }
    else {
      memcpy(__s._M_head_impl + uVar1,pvVar3,(size_t)__buf);
      uVar5 = this->capacity_;
      uVar4 = this->size_ + (short)__buf;
      if ((ulong)uVar5 - (long)__buf <= (ulong)this->size_) {
        uVar4 = uVar5;
      }
      this->size_ = uVar4;
      uVar1 = (ulong)((uint)this->i_ + (int)__buf);
      uVar2 = uVar1 / uVar5;
      this->i_ = (uint16_t)(uVar1 % (ulong)uVar5);
    }
    return uVar2;
  }
  this->i_ = 0;
  this->size_ = uVar5;
  pvVar3 = memcpy(__s._M_head_impl,(void *)((long)pvVar3 + ((long)__buf - (long)__n_00)),
                  (size_t)__n_00);
  return (ssize_t)pvVar3;
}

Assistant:

void
    write(std::uint8_t const* in, std::size_t n)
    {
        if(! p_)
            p_ = boost::make_unique<
                std::uint8_t[]>(capacity_);
        if(n >= capacity_)
        {
            i_ = 0;
            size_ = capacity_;
            std::memcpy(&p_[0], in + (n - size_), size_);
            return;
        }
        if(i_ + n <= capacity_)
        {
            std::memcpy(&p_[i_], in, n);
            if(size_ >= capacity_ - n)
                size_ = capacity_;
            else
                size_ = static_cast<std::uint16_t>(size_ + n);

            i_ = static_cast<std::uint16_t>(
                (i_ + n) % capacity_);
            return;
        }
        auto m = capacity_ - i_;
        std::memcpy(&p_[i_], in, m);
        in += m;
        i_ = static_cast<std::uint16_t>(n - m);
        std::memcpy(&p_[0], in, i_);
        size_ = capacity_;
    }